

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void __thiscall re2c::SwitchIf::emit(SwitchIf *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  if (this->type == IF) {
    If::emit((this->info).ifs,o,ind,readCh);
    return;
  }
  if (this->type == SWITCH) {
    Cases::emit((this->info).cases,o,ind,readCh);
    return;
  }
  return;
}

Assistant:

void SwitchIf::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	switch (type)
	{
		case SWITCH:
			info.cases->emit (o, ind, readCh);
			break;
		case IF:
			info.ifs->emit (o, ind, readCh);
			break;
	}
}